

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_TtHasVar(word *t,int nVars,int iVar)

{
  ulong *puVar1;
  word *pwVar2;
  word *pwVar3;
  byte bVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                  ,0x48b,"int Abc_TtHasVar(word *, int, int)");
  }
  if (6 < nVars) {
    if (iVar < 6) {
      iVar6 = 1;
      bVar4 = (char)nVars - 6U & 0x1f;
      uVar7 = 1 << bVar4;
      if (1 << bVar4 < 1) {
        uVar7 = 0;
      }
      uVar9 = 0;
      do {
        if (uVar7 == uVar9) {
          return 0;
        }
        puVar1 = t + uVar9;
        uVar9 = uVar9 + 1;
      } while ((s_Truths6Neg[iVar] &
               (*puVar1 >> ((byte)(1 << ((byte)iVar & 0x1f)) & 0x3f) ^ *puVar1)) == 0);
    }
    else {
      bVar8 = (byte)iVar - 6;
      bVar4 = bVar8 & 0x1f;
      uVar7 = 1 << bVar4;
      pwVar2 = t + (1 << ((char)nVars - 6U & 0x1f));
      iVar6 = 0 << bVar4;
      uVar9 = 0;
      if (0 < (int)uVar7) {
        uVar9 = (ulong)uVar7;
      }
      for (; t < pwVar2; t = t + (2 << (bVar8 & 0x1f))) {
        uVar10 = 0;
        while (uVar9 != uVar10) {
          pwVar3 = t + uVar10;
          lVar5 = (long)(int)uVar7 + uVar10;
          uVar10 = uVar10 + 1;
          if (*pwVar3 != t[lVar5]) {
            return 1;
          }
        }
      }
    }
    return iVar6;
  }
  iVar6 = Abc_Tt6HasVar(*t,iVar);
  return iVar6;
}

Assistant:

static inline int Abc_TtHasVar( word * t, int nVars, int iVar )
{
    assert( iVar < nVars );
    if ( nVars <= 6 )
        return Abc_Tt6HasVar( t[0], iVar );
    if ( iVar < 6 )
    {
        int i, Shift = (1 << iVar);
        int nWords = Abc_TtWordNum( nVars );
        for ( i = 0; i < nWords; i++ )
            if ( ((t[i] >> Shift) & s_Truths6Neg[iVar]) != (t[i] & s_Truths6Neg[iVar]) )
                return 1;
        return 0;
    }
    else
    {
        int i, Step = (1 << (iVar - 6));
        word * tLimit = t + Abc_TtWordNum( nVars );
        for ( ; t < tLimit; t += 2*Step )
            for ( i = 0; i < Step; i++ )
                if ( t[i] != t[Step+i] )
                    return 1;
        return 0;
    }
}